

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O3

void EthBasePort::GetDestMulticastMacAddr(uchar *macAddr)

{
  macAddr[4] = 0x94;
  macAddr[5] = 0xff;
  macAddr[0] = 0xfb;
  macAddr[1] = 'a';
  macAddr[2] = '\x0e';
  macAddr[3] = '\x13';
  return;
}

Assistant:

void EthBasePort::GetDestMacAddr(unsigned char *macAddr)
{
    // CID,0x1394,boardid(0)
    macAddr[0] = 0xFA;
    macAddr[1] = 0x61;
    macAddr[2] = 0x0E;
    macAddr[3] = 0x13;
    macAddr[4] = 0x94;
    macAddr[5] = 0x00;
}